

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O0

void __thiscall AwsCommandRunner::CopyFile(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *pMVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fd;
  undefined1 local_1fc;
  allocator local_1fb;
  allocator local_1fa;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  iterator local_150;
  size_type local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_121;
  undefined1 local_120;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_38 [8];
  string full_url;
  string *path_local;
  AwsCommandRunner *this_local;
  
  full_url.field_2._8_8_ = path;
  GetFullUrl((string *)local_38,this,path);
  pMVar1 = this->command_runner_;
  local_120 = 1;
  local_108 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"aws",&local_109);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"s3",local_11d);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"rm",&local_11e);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"--recursive",&local_11f);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::__cxx11::string::string((string *)local_108,(string *)local_38);
  local_120 = 0;
  local_60 = &local_100;
  local_58 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_121);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l_00,&local_121);
  MultipleCommandRunner::RunCommand(pMVar1,&local_50,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_121);
  local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_260 = local_260 + -1;
    std::__cxx11::string::~string((string *)local_260);
  } while (local_260 != &local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e);
  std::allocator<char>::~allocator((allocator<char> *)local_11d);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pMVar1 = this->command_runner_;
  local_1fc = 1;
  local_1f8 = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"aws",&local_1f9);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"s3",&local_1fa);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"cp",&local_1fb);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::__cxx11::string::string((string *)local_1f8,(string *)full_url.field_2._8_8_);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  std::__cxx11::string::string((string *)local_1f8,(string *)local_38);
  local_1fc = 0;
  local_150 = &local_1f0;
  local_148 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1fd);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,__l,&local_1fd);
  MultipleCommandRunner::RunCommand(pMVar1,&local_140,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1fd);
  local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
  do {
    local_2b8 = local_2b8 + -1;
    std::__cxx11::string::~string((string *)local_2b8);
  } while (local_2b8 != &local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fb);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void AwsCommandRunner::CopyFile(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", "--recursive", full_url},
                              false);
  command_runner_->RunCommand({"aws", "s3", "cp", path, full_url}, false);
}